

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::FlattenTo2DLayerParams::~FlattenTo2DLayerParams(FlattenTo2DLayerParams *this)

{
  ~FlattenTo2DLayerParams(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

FlattenTo2DLayerParams::~FlattenTo2DLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.FlattenTo2DLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}